

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

QString * __thiscall
VcprojGenerator::firstExpandedOutputFileName(VcprojGenerator *this,ProString *extraCompilerName)

{
  QMakeEvaluator *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProString firstOutput;
  ProString *pPVar1;
  ProString *variableName;
  ReplaceFor forShell;
  QString *out;
  QString *in;
  VcprojGenerator *this_00;
  undefined1 local_f0 [24];
  QString local_d8 [2];
  QString local_a8;
  undefined1 local_90 [88];
  _func_int **local_38;
  SourceFiles *pSStack_30;
  SourceFiles *local_28;
  bool bStack_20;
  undefined7 uStack_1f;
  Data *local_18;
  QMakeLocalFileName *pQStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (Data *)0xaaaaaaaaaaaaaaaa;
  pQStack_10 = (QMakeLocalFileName *)0xaaaaaaaaaaaaaaaa;
  local_28 = (SourceFiles *)0xaaaaaaaaaaaaaaaa;
  bStack_20 = true;
  uStack_1f = 0xaaaaaaaaaaaaaa;
  local_38 = (_func_int **)0xaaaaaaaaaaaaaaaa;
  pSStack_30 = (SourceFiles *)0xaaaaaaaaaaaaaaaa;
  pPVar1 = (ProString *)(in_RSI->m_superfile).d.size;
  variableName = in_RDI;
  local_90._24_16_ = (undefined1  [16])::operator+(pPVar1,(char (*) [8])in_RDI);
  ProKey::ProKey<ProString_const&,char_const(&)[8]>
            ((ProKey *)pPVar1,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)in_RDI);
  this_00 = (VcprojGenerator *)&stack0xffffffffffffffc8;
  QMakeEvaluator::first(in_RSI,(ProKey *)variableName);
  ProKey::~ProKey((ProKey *)0x28a55d);
  pPVar1 = (ProString *)local_90;
  ProString::toQString(in_RDI);
  in = local_d8;
  firstInputFileName(this_00,pPVar1);
  out = &local_a8;
  ProString::toQString(in_RDI);
  forShell = (ReplaceFor)((ulong)local_f0 >> 0x20);
  QString::QString((QString *)0x28a5b6);
  MakefileGenerator::replaceExtraCompilerVariables
            ((MakefileGenerator *)this_00,&pPVar1->m_string,in,out,forShell);
  QString::~QString((QString *)0x28a5e1);
  QString::~QString((QString *)0x28a5eb);
  ProString::~ProString((ProString *)0x28a5f5);
  QString::~QString((QString *)0x28a5ff);
  ProString::~ProString((ProString *)0x28a609);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return &in_RDI->m_string;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::firstExpandedOutputFileName(const ProString &extraCompilerName)
{
    const ProString firstOutput = project->first(ProKey(extraCompilerName + ".output"));
    return replaceExtraCompilerVariables(firstOutput.toQString(),
                                         firstInputFileName(extraCompilerName).toQString(),
                                         QString(), NoShell);
}